

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall
spv::Builder::setupFunctionDebugInfo
          (Builder *this,Function *function,char *name,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes,
          vector<const_char_*,_std::allocator<const_char_*>_> *paramNames)

{
  ulong argNumber;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  Op OVar1;
  Id *pIVar2;
  pointer puVar3;
  pointer ppcVar4;
  bool bVar5;
  Id IVar6;
  mapped_type_conflict *pmVar7;
  pointer puVar8;
  long lVar9;
  ulong uVar10;
  Id paramId;
  Id paramTypeId;
  Id debugFuncId;
  Id funcId;
  Id funcTypeId;
  Id local_9c;
  uint local_98;
  Id local_94;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_88;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  if (this->emitNonSemanticShaderDebugInfo == true) {
    local_90 = paramTypes;
    local_88 = paramNames;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,name,(allocator<char> *)&local_94);
    unmangleFunctionName(&local_50,(Builder *)name,&local_70);
    IVar6 = getStringId(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(Id)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_50._M_dataplus._M_p._4_4_,(Id)local_50._M_dataplus._M_p),
                      local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(Id)local_70._M_dataplus._M_p) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_70._M_dataplus._M_p._4_4_,(Id)local_70._M_dataplus._M_p),
                      local_70.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p._0_4_ = spv::Function::getFuncTypeId(function);
    this_00 = &this->debugId;
    pmVar7 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](this_00,(key_type *)&local_50);
    if (*pmVar7 == 0) {
      __assert_fail("debugId[funcTypeId] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x918,
                    "void spv::Builder::setupFunctionDebugInfo(Function *, const char *, const std::vector<Id> &, const std::vector<const char *> &)"
                   );
    }
    local_70._M_dataplus._M_p._0_4_ = (function->functionInstruction).resultId;
    if ((Id)local_70._M_dataplus._M_p == 0) {
      __assert_fail("funcId != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x91b,
                    "void spv::Builder::setupFunctionDebugInfo(Function *, const char *, const std::vector<Id> &, const std::vector<const char *> &)"
                   );
    }
    IVar6 = makeDebugFunction(this,function,IVar6,(Id)local_50._M_dataplus._M_p);
    local_94 = IVar6;
    pmVar7 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](this_00,(key_type *)&local_70);
    *pmVar7 = IVar6;
    local_80 = &this->currentDebugScopeId;
    pIVar2 = (this->currentDebugScopeId).c.
             super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pIVar2 == (this->currentDebugScopeId).c.
                  super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_int,std::allocator<unsigned_int>>::_M_push_back_aux<unsigned_int_const&>
                ((deque<unsigned_int,std::allocator<unsigned_int>> *)local_80,&local_94);
    }
    else {
      *pIVar2 = IVar6;
      (this->currentDebugScopeId).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur = pIVar2 + 1;
    }
    puVar8 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar9 = (long)puVar3 - (long)puVar8 >> 2;
    if (lVar9 != (long)(local_88->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_88->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3) {
      __assert_fail("paramTypes.size() == paramNames.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x923,
                    "void spv::Builder::setupFunctionDebugInfo(Function *, const char *, const std::vector<Id> &, const std::vector<const char *> &)"
                   );
    }
    if ((0 < (int)lVar9) && (puVar3 != puVar8)) {
      local_78 = (ulong)(*(function->parameterInstructions).
                          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->resultId;
      uVar10 = 0;
      do {
        local_98 = puVar8[uVar10];
        OVar1 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[local_98]->opCode;
        if ((OVar1 == OpTypePointer) || (OVar1 == OpTypeArray)) {
          local_98 = getContainedTypeId(this,local_98,0);
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
        ppcVar4 = (local_88->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pmVar7 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](this_00,&local_98);
        argNumber = uVar10 + 1;
        IVar6 = createDebugLocalVariable(this,*pmVar7,ppcVar4[uVar10],argNumber);
        local_9c = (int)uVar10 + (int)local_78;
        pmVar7 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](this_00,&local_9c);
        *pmVar7 = IVar6;
        if (bVar5) {
          makeDebugDeclare(this,IVar6,local_9c);
        }
        else {
          makeDebugValue(this,IVar6,local_9c);
        }
        puVar8 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar10 = argNumber;
      } while (argNumber <
               (ulong)((long)(local_90->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 2));
    }
    if (this->emitNonSemanticShaderDebugInfo == true) {
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&local_80->c);
    }
  }
  return;
}

Assistant:

void Builder::setupFunctionDebugInfo(Function* function, const char* name, const std::vector<Id>& paramTypes,
                                     const std::vector<char const*>& paramNames)
{

    if (!emitNonSemanticShaderDebugInfo)
        return;

    Id nameId = getStringId(unmangleFunctionName(name));
    Id funcTypeId = function->getFuncTypeId();
    assert(debugId[funcTypeId] != 0);
    Id funcId = function->getId();

    assert(funcId != 0);

    // Make the debug function instruction
    Id debugFuncId = makeDebugFunction(function, nameId, funcTypeId);
    debugId[funcId] = debugFuncId;
    currentDebugScopeId.push(debugFuncId);

    // DebugScope and DebugLine for parameter DebugDeclares
    assert(paramTypes.size() == paramNames.size());
    if ((int)paramTypes.size() > 0) {
        Id firstParamId = function->getParamId(0);

        for (size_t p = 0; p < paramTypes.size(); ++p) {
            bool passByRef = false;
            Id paramTypeId = paramTypes[p];

            // For pointer-typed parameters, they are actually passed by reference and we need unwrap the pointer to get the actual parameter type.
            if (isPointerType(paramTypeId) || isArrayType(paramTypeId)) {
                passByRef = true;
                paramTypeId = getContainedTypeId(paramTypeId);
            }

            auto const& paramName = paramNames[p];
            auto const debugLocalVariableId = createDebugLocalVariable(debugId[paramTypeId], paramName, p + 1);
            auto const paramId = static_cast<Id>(firstParamId + p);
            debugId[paramId] = debugLocalVariableId;

            if (passByRef) {
                makeDebugDeclare(debugLocalVariableId, paramId);
            } else {
                makeDebugValue(debugLocalVariableId, paramId);
            }
        }
    }

    // Clear debug scope stack
    if (emitNonSemanticShaderDebugInfo)
        currentDebugScopeId.pop();
}